

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

void __thiscall kj::InsertionOrderIndex::reserve(InsertionOrderIndex *this,size_t size)

{
  uint uVar1;
  Link *__src;
  int iVar2;
  uint uVar3;
  Link *__dest;
  ulong uVar4;
  Fault f;
  DebugComparison<unsigned_long_&,_unsigned_int> _kjCondition;
  size_t size_local;
  
  _kjCondition.left = &size_local;
  _kjCondition.right = 0x80000000;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = (size & 0xffffffff80000000) == 0;
  size_local = size;
  if (_kjCondition.result) {
    uVar1 = this->capacity;
    if (uVar1 < size) {
      iVar2 = 0x1f;
      if ((uint)size != 0) {
        for (; (uint)size >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar3 = 2 << ((byte)iVar2 & 0x1f);
      uVar4 = 8;
      if (8 < uVar3) {
        uVar4 = (ulong)uVar3;
      }
      __dest = (Link *)operator_new__(uVar4 * 8);
      __src = this->links;
      memcpy(__dest,__src,(ulong)(uVar1 + 1) << 3);
      if (__src != (Link *)0x0 && __src != (Link *)&EMPTY_LINK) {
        operator_delete__(__src);
      }
      this->links = __dest;
      this->capacity = (int)uVar4 - 1;
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_int>&,char_const(&)[38]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
             ,0x324,FAILED,"size < (1u << 31)",
             "_kjCondition,\"Table too big for InsertionOrderIndex\"",&_kjCondition,
             (char (*) [38])"Table too big for InsertionOrderIndex");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void InsertionOrderIndex::reserve(size_t size) {
  KJ_ASSERT(size < (1u << 31), "Table too big for InsertionOrderIndex");

  if (size > capacity) {
    // Need to grow.
    // Note that `size` and `capacity` do not include the special link[0].

    // Round up to the next power of 2.
    size_t allocation = 1u << (_::lg(size) + 1);
    KJ_DASSERT(allocation > size);
    KJ_DASSERT(allocation <= size * 2);

    // Round first allocation up to 8.
    allocation = kj::max(allocation, 8);

    Link* newLinks = new Link[allocation];
#ifdef KJ_DEBUG
    // To catch bugs, fill unused links with 0xff.
    memset(newLinks, 0xff, allocation * sizeof(Link));
#endif
    _::acopy(newLinks, links, capacity + 1);
    if (links != &EMPTY_LINK) delete[] links;
    links = newLinks;
    capacity = allocation - 1;
  }
}